

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::BadCommandBufferCase::iterate(BadCommandBufferCase *this)

{
  undefined *puVar1;
  deUint32 program_00;
  deUint32 dVar2;
  deUint32 err;
  RenderContext *pRVar3;
  TestLog *pTVar4;
  ProgramSources *pPVar5;
  reference pvVar6;
  size_type sVar7;
  MessageBuilder *pMVar8;
  Enum<int,_2UL> EVar9;
  MessageBuilder local_7a8;
  GetNameFunc local_628;
  int local_620;
  Enum<int,_2UL> local_618;
  GetNameFunc local_608;
  int local_600;
  Enum<int,_2UL> local_5f8;
  MessageBuilder local_5e8;
  undefined1 local_468 [8];
  vector<signed_char,_std::allocator<signed_char>_> drawCommandBuffer;
  DrawElementsCommand drawCommand;
  deInt32 posLocation;
  deUint32 programID;
  ShaderSource local_410;
  allocator<char> local_3e1;
  string local_3e0;
  ShaderSource local_3c0;
  ProgramSources local_388;
  undefined1 local_2b8 [8];
  ShaderProgram program;
  deUint32 local_1e0;
  deUint32 error;
  deUint32 drawIndirectBuf;
  deUint32 indexBuf;
  deUint32 positionBuf;
  deUint32 vaoID;
  undefined1 local_1c0 [8];
  GLContext gl;
  deUint16 indices [3];
  Vec4 vertexPositions [3];
  BadCommandBufferCase *this_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)indices,0.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(vertexPositions[0].m_data + 2),1.0,0.0,0.0,1.0)
  ;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(vertexPositions[1].m_data + 2),0.0,1.0,0.0,1.0)
  ;
  gl.m_programs.super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_2_ = 1;
  gl.m_programs.super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x20000;
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&positionBuf,0,0,1,1);
  sglr::GLContext::GLContext((GLContext *)local_1c0,pRVar3,pTVar4,1,(Vector<int,_4> *)&positionBuf);
  indexBuf = 0;
  drawIndirectBuf = 0;
  error = 0;
  local_1e0 = 0;
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_388);
  puVar1 = Functional::(anonymous_namespace)::s_commonVertexShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,puVar1,&local_3e1);
  glu::VertexSource::VertexSource((VertexSource *)&local_3c0,&local_3e0);
  pPVar5 = glu::ProgramSources::operator<<(&local_388,&local_3c0);
  puVar1 = Functional::(anonymous_namespace)::s_commonFragmentShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&programID,puVar1,(allocator<char> *)((long)&posLocation + 3));
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_410,(string *)&programID);
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,&local_410);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_2b8,pRVar3,pPVar5);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_410);
  std::__cxx11::string::~string((string *)&programID);
  std::allocator<char>::~allocator((allocator<char> *)((long)&posLocation + 3));
  glu::VertexSource::~VertexSource((VertexSource *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  glu::ProgramSources::~ProgramSources(&local_388);
  program_00 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2b8);
  dVar2 = sglr::GLContext::getAttribLocation((GLContext *)local_1c0,program_00,"a_position");
  drawCommandBuffer.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 3;
  drawCommandBuffer.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)local_468);
  std::vector<signed_char,_std::allocator<signed_char>_>::resize
            ((vector<signed_char,_std::allocator<signed_char>_> *)local_468,
             (ulong)this->m_bufferSize);
  pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                     ((vector<signed_char,_std::allocator<signed_char>_> *)local_468,0);
  sVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                    ((vector<signed_char,_std::allocator<signed_char>_> *)local_468);
  ::deMemset(pvVar6,0,(long)(int)sVar7);
  if ((this->m_writeCommandToBuffer & 1U) != 0) {
    pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)local_468,
                        (ulong)this->m_alignment);
    ::deMemcpy(pvVar6,&drawCommandBuffer.
                       super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,0x14);
  }
  err = sglr::GLContext::getError((GLContext *)local_1c0);
  glu::checkError(err,"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x91d);
  sglr::GLContext::genVertexArrays((GLContext *)local_1c0,1,&indexBuf);
  sglr::GLContext::bindVertexArray((GLContext *)local_1c0,indexBuf);
  sglr::GLContext::genBuffers((GLContext *)local_1c0,1,&drawIndirectBuf);
  sglr::GLContext::bindBuffer((GLContext *)local_1c0,0x8892,drawIndirectBuf);
  sglr::GLContext::bufferData((GLContext *)local_1c0,0x8892,0x30,indices,0x88e4);
  sglr::GLContext::vertexAttribPointer((GLContext *)local_1c0,dVar2,4,0x1406,0,0,(void *)0x0);
  sglr::GLContext::vertexAttribDivisor((GLContext *)local_1c0,dVar2,0);
  sglr::GLContext::enableVertexAttribArray((GLContext *)local_1c0,dVar2);
  dVar2 = sglr::GLContext::getError((GLContext *)local_1c0);
  glu::checkError(dVar2,"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x927);
  sglr::GLContext::genBuffers((GLContext *)local_1c0,1,&error);
  sglr::GLContext::bindBuffer((GLContext *)local_1c0,0x8893,error);
  sglr::GLContext::bufferData
            ((GLContext *)local_1c0,0x8893,6,
             &gl.m_programs.
              super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0x88e4);
  dVar2 = sglr::GLContext::getError((GLContext *)local_1c0);
  glu::checkError(dVar2,"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x92c);
  sglr::GLContext::genBuffers((GLContext *)local_1c0,1,&local_1e0);
  sglr::GLContext::bindBuffer((GLContext *)local_1c0,0x8f3f,local_1e0);
  sVar7 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                    ((vector<signed_char,_std::allocator<signed_char>_> *)local_468);
  pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                     ((vector<signed_char,_std::allocator<signed_char>_> *)local_468,0);
  sglr::GLContext::bufferData((GLContext *)local_1c0,0x8f3f,sVar7,pvVar6,0x88e4);
  dVar2 = sglr::GLContext::getError((GLContext *)local_1c0);
  glu::checkError(dVar2,"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x931);
  sglr::GLContext::viewport((GLContext *)local_1c0,0,0,1,1);
  sglr::GLContext::useProgram((GLContext *)local_1c0,program_00);
  sglr::GLContext::drawElementsIndirect
            ((GLContext *)local_1c0,4,0x1403,(void *)(ulong)this->m_alignment);
  program.m_program.m_info.linkTimeUs._4_4_ = sglr::GLContext::getError((GLContext *)local_1c0);
  sglr::GLContext::useProgram((GLContext *)local_1c0,0);
  sglr::GLContext::deleteBuffers((GLContext *)local_1c0,1,&local_1e0);
  sglr::GLContext::deleteBuffers((GLContext *)local_1c0,1,&error);
  sglr::GLContext::deleteBuffers((GLContext *)local_1c0,1,&drawIndirectBuf);
  sglr::GLContext::deleteVertexArrays((GLContext *)local_1c0,1,&indexBuf);
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_5e8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<
                     (&local_5e8,(char (*) [32])"drawElementsIndirect generated ");
  EVar9 = glu::getErrorStr(program.m_program.m_info.linkTimeUs._4_4_);
  local_608 = EVar9.m_getName;
  local_600 = EVar9.m_value;
  local_5f8.m_getName = local_608;
  local_5f8.m_value = local_600;
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_5f8);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [13])0x2c2d409);
  EVar9 = glu::getErrorStr(this->m_expectedError);
  local_628 = EVar9.m_getName;
  local_620 = EVar9.m_value;
  local_618.m_getName = local_628;
  local_618.m_value = local_620;
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_618);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2b6cb9a);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_5e8);
  if (program.m_program.m_info.linkTimeUs._4_4_ == this->m_expectedError) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_7a8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_7a8,(char (*) [19])"\tUnexpected error.");
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_7a8);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Got unexpected error.");
  }
  std::vector<signed_char,_std::allocator<signed_char>_>::~vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)local_468);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_2b8);
  sglr::GLContext::~GLContext((GLContext *)local_1c0);
  return STOP;
}

Assistant:

BadCommandBufferCase::IterateResult	BadCommandBufferCase::iterate (void)
{
	const tcu::Vec4 vertexPositions[] =
	{
		tcu::Vec4(0,	0,		0, 1),
		tcu::Vec4(1,	0,		0, 1),
		tcu::Vec4(0,	1,		0, 1),
	};

	const deUint16 indices[] =
	{
		0, 2, 1,
	};

	DE_STATIC_ASSERT(CommandSize == sizeof(DrawElementsCommand));

	sglr::GLContext gl(m_context.getRenderContext(), m_testCtx.getLog(), sglr::GLCONTEXT_LOG_CALLS, tcu::IVec4(0, 0, 1, 1));

	deUint32 vaoID			= 0;
	deUint32 positionBuf	= 0;
	deUint32 indexBuf		= 0;
	deUint32 drawIndirectBuf= 0;
	deUint32 error;

	glu::ShaderProgram	program			(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(s_commonVertexShaderSource) << glu::FragmentSource(s_commonFragmentShaderSource));
	deUint32			programID		= program.getProgram();
	deInt32				posLocation		= gl.getAttribLocation(programID, "a_position");

	DrawElementsCommand drawCommand;
	drawCommand.count				= 3;
	drawCommand.primCount			= 1;
	drawCommand.firstIndex			= 0;
	drawCommand.baseVertex			= 0;
	drawCommand.reservedMustBeZero	= 0;

	std::vector<deInt8> drawCommandBuffer;
	drawCommandBuffer.resize(m_bufferSize);

	deMemset(&drawCommandBuffer[0], 0, (int)drawCommandBuffer.size());

	if (m_writeCommandToBuffer)
	{
		DE_ASSERT(drawCommandBuffer.size() >= sizeof(drawCommand) + m_alignment);
		deMemcpy(&drawCommandBuffer[m_alignment], &drawCommand, sizeof(drawCommand));
	}

	glu::checkError(gl.getError(), "", __FILE__, __LINE__);
	gl.genVertexArrays(1, &vaoID);
	gl.bindVertexArray(vaoID);

	gl.genBuffers(1, &positionBuf);
	gl.bindBuffer(GL_ARRAY_BUFFER, positionBuf);
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(vertexPositions), vertexPositions, GL_STATIC_DRAW);
	gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	gl.vertexAttribDivisor(posLocation, 0);
	gl.enableVertexAttribArray(posLocation);
	glu::checkError(gl.getError(), "", __FILE__, __LINE__);

	gl.genBuffers(1, &indexBuf);
	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, indexBuf);
	gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(indices), indices, GL_STATIC_DRAW);
	glu::checkError(gl.getError(), "", __FILE__, __LINE__);

	gl.genBuffers(1, &drawIndirectBuf);
	gl.bindBuffer(GL_DRAW_INDIRECT_BUFFER, drawIndirectBuf);
	gl.bufferData(GL_DRAW_INDIRECT_BUFFER, drawCommandBuffer.size(), &drawCommandBuffer[0], GL_STATIC_DRAW);
	glu::checkError(gl.getError(), "", __FILE__, __LINE__);

	gl.viewport(0, 0, 1, 1);

	gl.useProgram(programID);
	gl.drawElementsIndirect(GL_TRIANGLES, GL_UNSIGNED_SHORT, (const void*)(deUintptr)m_alignment);

	error = gl.getError();

	gl.useProgram(0);

	gl.deleteBuffers(1, &drawIndirectBuf);
	gl.deleteBuffers(1, &indexBuf);
	gl.deleteBuffers(1, &positionBuf);
	gl.deleteVertexArrays(1, &vaoID);

	m_testCtx.getLog() << tcu::TestLog::Message << "drawElementsIndirect generated " << glu::getErrorStr(error) << ", expecting " << glu::getErrorStr(m_expectedError) << "." << tcu::TestLog::EndMessage;

	if (error == m_expectedError)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tUnexpected error." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got unexpected error.");
	}

	return STOP;
}